

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void parse_new_section(parse_state *state,int kw,int nargs,char **args)

{
  listnode *__s;
  int iVar1;
  size_t sVar2;
  ushort **ppuVar3;
  code *pcVar4;
  char cVar5;
  char *pcVar6;
  listnode *plVar7;
  ulong uVar8;
  
  if (nargs < 2) {
    pcVar6 = "";
  }
  else {
    pcVar6 = args[1];
  }
  printf("[ %s %s ]\n",*args,pcVar6);
  if (kw == 0x15) {
    if (nargs < 2) {
      pcVar6 = "actions must have a trigger\n";
LAB_00106bee:
      parse_error(state,pcVar6);
      goto LAB_00106bfb;
    }
    if (nargs != 2) {
      pcVar6 = "actions may not have extra parameters\n";
      goto LAB_00106bee;
    }
    plVar7 = (listnode *)calloc(1,0x58);
    plVar7[3].prev = (listnode *)args[1];
    list_init(plVar7 + 4);
    list_add_tail(&action_list,plVar7);
    pcVar4 = parse_line_action;
  }
  else {
    if (kw != 0x19) {
      pcVar4 = parse_line_no_op;
      goto LAB_00106c06;
    }
    if (nargs < 3) {
      pcVar6 = "services must have a name and a program\n";
      goto LAB_00106bee;
    }
    __s = (listnode *)args[1];
    sVar2 = strlen((char *)__s);
    if (sVar2 < 0x11) {
      cVar5 = *(char *)&__s->next;
      if (cVar5 != '\0') {
        ppuVar3 = __ctype_b_loc();
        plVar7 = __s;
        do {
          plVar7 = (listnode *)((long)&plVar7->next + 1);
          if (((((*ppuVar3)[cVar5] & 8) == 0) && (cVar5 != '_')) && (cVar5 != '-'))
          goto LAB_00106b10;
          cVar5 = *(char *)&plVar7->next;
        } while (cVar5 != '\0');
      }
      plVar7 = &service_list;
      do {
        plVar7 = plVar7->next;
        if (plVar7 == &service_list) goto LAB_00106c19;
        iVar1 = strcmp((char *)plVar7[1].next,(char *)__s);
      } while (iVar1 != 0);
      if (plVar7 == (listnode *)0x0) {
LAB_00106c19:
        uVar8 = (ulong)(nargs - 2U);
        plVar7 = (listnode *)calloc(1,uVar8 * 8 + 0xf0);
        if (plVar7 != (listnode *)0x0) {
          plVar7[1].next = __s;
          plVar7[1].prev = (listnode *)"default";
          memcpy(&plVar7[0xe].prev,args + 2,uVar8 * 8);
          (&plVar7[0xe].prev)[uVar8] = (listnode *)0x0;
          *(uint *)&plVar7[0xe].next = nargs - 2U;
          plVar7[0xb].next = (listnode *)"onrestart";
          list_init((listnode *)&plVar7[0xb].prev);
          list_add_tail(&service_list,plVar7);
          pcVar4 = parse_line_service;
          goto LAB_00106c02;
        }
        pcVar6 = "out of memory\n";
        goto LAB_00106bee;
      }
      pcVar6 = "ignored duplicate definition of service \'%s\'\n";
    }
    else {
LAB_00106b10:
      pcVar6 = "invalid service name \'%s\'\n";
    }
    parse_error(state,pcVar6,__s);
LAB_00106bfb:
    plVar7 = (listnode *)0x0;
    pcVar4 = parse_line_no_op;
  }
LAB_00106c02:
  state->context = plVar7;
LAB_00106c06:
  state->parse_line = pcVar4;
  return;
}

Assistant:

void parse_new_section(struct parse_state *state, int kw,
                       int nargs, char **args)
{
    printf("[ %s %s ]\n", args[0],
           nargs > 1 ? args[1] : "");
    switch(kw) {
    case K_service:
        state->context = parse_service(state, nargs, args);
        if (state->context) {
            state->parse_line = parse_line_service;
            return;
        }
        break;
    case K_on:
        state->context = parse_action(state, nargs, args);
        if (state->context) {
            state->parse_line = parse_line_action;
            return;
        }
        break;
    }
    state->parse_line = parse_line_no_op;
}